

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O2

int __thiscall
CTcParser::match_template
          (CTcParser *this,CTcObjTemplateItem *tpl_head,CTcObjTemplateInst *src,size_t src_cnt)

{
  CTcObjTemplateItem CVar1;
  bool bVar2;
  int iVar3;
  CTcObjTemplateItem *pCVar4;
  
  do {
    if ((tpl_head == (CTcObjTemplateItem *)0x0) || (src_cnt == 0)) {
      for (; (tpl_head != (CTcObjTemplateItem *)0x0 && (((byte)tpl_head[0x18] & 2) != 0));
          tpl_head = *(CTcObjTemplateItem **)(tpl_head + 0x10)) {
      }
      return (uint)(tpl_head == (CTcObjTemplateItem *)0x0 && src_cnt == 0);
    }
    CVar1 = tpl_head[0x18];
    bVar2 = false;
    do {
      pCVar4 = tpl_head;
      if (*(tc_toktyp_t *)(pCVar4 + 8) == src->def_tok_) {
        src->prop_ = *(CTcSymProp **)pCVar4;
        bVar2 = true;
      }
    } while ((((byte)pCVar4[0x18] & 1) != 0) &&
            (tpl_head = *(CTcObjTemplateItem **)(pCVar4 + 0x10),
            *(CTcObjTemplateItem **)(pCVar4 + 0x10) != (CTcObjTemplateItem *)0x0));
    if (((byte)CVar1 & 2) == 0) {
      if (!bVar2) {
        return 0;
      }
      src = src + 1;
      src_cnt = src_cnt - 1;
    }
    else if ((bVar2) &&
            (iVar3 = match_template(this,*(CTcObjTemplateItem **)(pCVar4 + 0x10),src + 1,src_cnt - 1
                                   ), iVar3 != 0)) {
      return 1;
    }
    tpl_head = *(CTcObjTemplateItem **)(pCVar4 + 0x10);
  } while( true );
}

Assistant:

int CTcParser::match_template(const CTcObjTemplateItem *tpl_head,
                              CTcObjTemplateInst *src, size_t src_cnt)
{
    /* check each element of the list */
    CTcObjTemplateInst *p;
    const CTcObjTemplateItem *item;
    size_t rem;
    for (p = src, rem = src_cnt, item = tpl_head ; item != 0 && rem != 0 ;
         item = item->nxt_)
    {
        /* 
         *   Note whether or not this item is optional.  Every element of an
         *   alternative group must have the same optional status, so we need
         *   only note the status of the first item if this is a group. 
         */
        int is_opt = item->is_opt_;

        /* 
         *   Scan each alternative in the current group.  Note that if we're
         *   not in an alternative group, the logic is the same: we won't
         *   have any 'alt' flags, so we'll just scan a single item. 
         */
        int match;
        for (match = FALSE ; ; item = item->nxt_)
        {
            /* if this one matches, note the match */
            if (item->tok_type_ == p->def_tok_)
            {
                /* note the match */
                match = TRUE;
                
                /* this is the property to assign for the actual */
                p->prop_ = item->prop_;
            }

            /* 
             *   If this one is not marked as an alternative, we're done.
             *   The last item of an alternative group is identified by
             *   having its 'alt' flag cleared.  Also, if we somehow have an
             *   ill-formed list, where we don't have a terminating
             *   non-flagged item, we can stop now as well.  
             */
            if (!item->is_alt_ || item->nxt_ == 0)
                break;
        }

        /* check to see if the current item is optional */
        if (is_opt)
        {
            /* 
             *   The item is optional.  If it matches, try it both ways:
             *   first try matching the item, then try skipping it.  If we
             *   can match this item and still match the rest of the string,
             *   take that interpretation; otherwise, if we can skip this
             *   item and match the rest of the string, take *that*
             *   interpretation.  If we can't match it either way, we don't
             *   have a match.  
             *   
             *   First, check to see if we can match the item and still match
             *   the rest of the string.  
             */
            if (match && match_template(item->nxt_, p + 1, rem - 1))
            {
                /* we have a match */
                return TRUE;
            }

            /* 
             *   Matching this optional item doesn't let us match the rest of
             *   the string, so try it with this optional item omitted - in
             *   other words, just match the rest of the string, including
             *   the current source item, to the rest of the template,
             *   *excluding* the current optional item.
             *   
             *   There's no need to recurse to do this; simply continue
             *   iterating, but do NOT skip the current source item.  
             */
        }
        else
        {
            /* 
             *   It's not optional, so if it doesn't match, the whole
             *   template fails to match; if it does match, simply proceed
             *   through the rest of the template.  
             */
            if (!match)
                return FALSE;

            /* we matched, so consume this source item */
            ++p;
            --rem;
        }
    }

    /* skip any trailing optional items in the template list */
    while (item != 0 && item->is_opt_)
        item = item->nxt_;
    
    /* 
     *   it's a match if and only if we reached the end of both lists at the
     *   same time 
     */
    return (item == 0 && rem == 0);
}